

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_dsp.c
# Opt level: O1

uint64_t SharpYuvUpdateY_C(uint16_t *ref,uint16_t *src,uint16_t *dst,int len,int bit_depth)

{
  uint uVar1;
  uint64_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint16_t uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  if (0 < len) {
    uVar6 = ~(-1 << ((byte)bit_depth & 0x1f));
    uVar7 = 0;
    uVar2 = 0;
    do {
      iVar8 = (uint)ref[uVar7] - (uint)src[uVar7];
      uVar4 = (uint)dst[uVar7] + iVar8;
      uVar1 = uVar6;
      if ((int)uVar4 < (int)uVar6) {
        uVar1 = uVar4;
      }
      uVar5 = (uint16_t)uVar1;
      if ((int)uVar4 < 0) {
        uVar5 = 0;
      }
      dst[uVar7] = uVar5;
      uVar3 = -(ushort)iVar8;
      if (0 < iVar8) {
        uVar3 = (ushort)iVar8;
      }
      uVar2 = uVar2 + uVar3;
      uVar7 = uVar7 + 1;
    } while ((uint)len != uVar7);
    return uVar2;
  }
  return 0;
}

Assistant:

static uint64_t SharpYuvUpdateY_C(const uint16_t* ref, const uint16_t* src,
                                  uint16_t* dst, int len, int bit_depth) {
  uint64_t diff = 0;
  int i;
  const int max_y = (1 << bit_depth) - 1;
  for (i = 0; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip(new_y, max_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}